

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall t_dart_generator::generate_dart_pubspec(t_dart_generator *this)

{
  int *piVar1;
  t_program *ptVar2;
  pointer pptVar3;
  ostream *poVar4;
  int __oflag;
  int __fd;
  pointer pptVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  pointer pbVar6;
  allocator local_211;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string f_pubspec_name;
  ofstream_with_content_based_conditional_update f_pubspec;
  
  std::operator+(&f_pubspec_name,&this->base_dir_,"/pubspec.yaml");
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&f_pubspec);
  std::__cxx11::string::string((string *)&lines,f_pubspec_name._M_dataplus._M_p,&local_211);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&f_pubspec,(char *)&lines,__oflag);
  std::__cxx11::string::~string((string *)&lines);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&f_pubspec);
  poVar4 = std::operator<<(poVar4,"name: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->library_name_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&f_pubspec);
  poVar4 = std::operator<<(poVar4,"version: 0.0.1");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&f_pubspec);
  poVar4 = std::operator<<(poVar4,"description: Autogenerated by Thrift Compiler");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)&f_pubspec,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&f_pubspec);
  poVar4 = std::operator<<(poVar4,"environment:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&f_pubspec);
  poVar4 = std::operator<<(poVar4,"sdk: \'>=1.24.3 <3.0.0\'");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::operator<<((ostream *)&f_pubspec,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&f_pubspec);
  poVar4 = std::operator<<(poVar4,"dependencies:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if ((this->pubspec_lib_)._M_string_length == 0) {
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&f_pubspec);
    poVar4 = std::operator<<(poVar4,"thrift:  # ^");
    poVar4 = std::operator<<(poVar4,(string *)&dart_thrift_version_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&f_pubspec);
    poVar4 = std::operator<<(poVar4,"path: ../../../../lib/dart");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
  }
  else {
    split(&lines,this,&this->pubspec_lib_,'|');
    for (pbVar6 = lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&f_pubspec);
      poVar4 = std::operator<<(poVar4,(string *)pbVar6);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&lines);
  }
  ptVar2 = (this->super_t_oop_generator).super_t_generator.program_;
  pptVar3 = (ptVar2->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (pptVar5 = (ptVar2->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; pptVar5 != pptVar3; pptVar5 = pptVar5 + 1
      ) {
    find_library_name_abi_cxx11_((string *)&lines,this,*pptVar5);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&f_pubspec);
    poVar4 = std::operator<<(poVar4,(string *)&lines);
    poVar4 = std::operator<<(poVar4,":");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&f_pubspec);
    poVar4 = std::operator<<(poVar4,"path: ../");
    poVar4 = std::operator<<(poVar4,(string *)&lines);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    std::__cxx11::string::~string((string *)&lines);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  __fd = 0x36bcd8;
  std::operator<<((ostream *)&f_pubspec,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&f_pubspec,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&f_pubspec);
  std::__cxx11::string::~string((string *)&f_pubspec_name);
  return;
}

Assistant:

void t_dart_generator::generate_dart_pubspec() {
  string f_pubspec_name = base_dir_ + "/pubspec.yaml";
  ofstream_with_content_based_conditional_update f_pubspec;
  f_pubspec.open(f_pubspec_name.c_str());

  indent(f_pubspec) << "name: " << library_name_ << endl;
  indent(f_pubspec) << "version: 0.0.1" << endl;
  indent(f_pubspec) << "description: Autogenerated by Thrift Compiler" << endl;
  f_pubspec << endl;

  indent(f_pubspec) << "environment:" << endl;
  indent_up();
  indent(f_pubspec) << "sdk: '>=1.24.3 <3.0.0'" << endl;
  indent_down();
  f_pubspec << endl;

  indent(f_pubspec) << "dependencies:" << endl;
  indent_up();

  if (pubspec_lib_.empty()) {
    // default to relative path within working directory, which works for tests
    indent(f_pubspec) << "thrift:  # ^" << dart_thrift_version << endl;
    indent_up();
    indent(f_pubspec) << "path: ../../../../lib/dart" << endl;
    indent_down();
  } else {
    const vector<std::string> lines = split(pubspec_lib_, '|');
    for (const auto & line : lines) {
      indent(f_pubspec) << line << endl;
    }
  }

  // add included thrift files as dependencies
  const vector<t_program*>& includes = program_->get_includes();
  for (auto include : includes) {
    string include_name = find_library_name(include);
    indent(f_pubspec) << include_name << ":" << endl;
    indent_up();
    indent(f_pubspec) << "path: ../" << include_name << endl;
    indent_down();
  }

  indent_down();
  f_pubspec << endl;

  f_pubspec.close();
}